

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O1

_Bool isVariable(char *str)

{
  variable **ppvVar1;
  int iVar2;
  variable *pvVar3;
  _Bool _Var4;
  
  pvVar3 = variables_first;
  if (variables_first == (variable *)0x0 || str == (char *)0x0) {
    _Var4 = false;
  }
  else {
    do {
      iVar2 = strcmp(str,pvVar3->key);
      _Var4 = iVar2 == 0;
      if (_Var4) {
        return _Var4;
      }
      ppvVar1 = &pvVar3->next;
      pvVar3 = *ppvVar1;
    } while (*ppvVar1 != (variable *)0x0);
  }
  return _Var4;
}

Assistant:

bool isVariable(const char *str)
{
    struct variable *var = variables_first;

    if (str == NULL) {
        return false;
    }

    while (var != NULL) {
        if (!strcmp(str, var->key)) {
            return true;
        }

        var = var->next;
    }

    return false;
}